

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stream_encoder_mt.c
# Opt level: O0

void threads_stop(lzma_stream_coder_conflict1 *coder,_Bool wait_for_threads)

{
  bool bVar1;
  uint mythread_j_436;
  uint mythread_i_436;
  uint32_t i_1;
  uint mythread_j_425;
  uint mythread_i_425;
  uint32_t i;
  _Bool wait_for_threads_local;
  lzma_stream_coder_conflict1 *coder_local;
  
  for (mythread_j_425 = 0; mythread_j_425 < coder->threads_initialized;
      mythread_j_425 = mythread_j_425 + 1) {
    bVar1 = false;
    while (!bVar1) {
      mythread_mutex_lock(&coder->threads[mythread_j_425].mutex);
      bVar1 = false;
      while (!bVar1) {
        coder->threads[mythread_j_425].state = THR_STOP;
        mythread_cond_signal(&coder->threads[mythread_j_425].cond);
        bVar1 = true;
      }
      bVar1 = true;
    }
    mythread_mutex_unlock(&coder->threads[mythread_j_425].mutex);
  }
  if (wait_for_threads) {
    for (mythread_j_436 = 0; mythread_j_436 < coder->threads_initialized;
        mythread_j_436 = mythread_j_436 + 1) {
      bVar1 = false;
      while (!bVar1) {
        mythread_mutex_lock(&coder->threads[mythread_j_436].mutex);
        bVar1 = false;
        while (!bVar1) {
          while (coder->threads[mythread_j_436].state != THR_IDLE) {
            mythread_cond_wait(&coder->threads[mythread_j_436].cond,
                               &coder->threads[mythread_j_436].mutex);
          }
          bVar1 = true;
        }
        bVar1 = true;
      }
      mythread_mutex_unlock(&coder->threads[mythread_j_436].mutex);
    }
  }
  return;
}

Assistant:

static void
threads_stop(lzma_stream_coder *coder, bool wait_for_threads)
{
	// Tell the threads to stop.
	for (uint32_t i = 0; i < coder->threads_initialized; ++i) {
		mythread_sync(coder->threads[i].mutex) {
			coder->threads[i].state = THR_STOP;
			mythread_cond_signal(&coder->threads[i].cond);
		}
	}

	if (!wait_for_threads)
		return;

	// Wait for the threads to settle in the idle state.
	for (uint32_t i = 0; i < coder->threads_initialized; ++i) {
		mythread_sync(coder->threads[i].mutex) {
			while (coder->threads[i].state != THR_IDLE)
				mythread_cond_wait(&coder->threads[i].cond,
						&coder->threads[i].mutex);
		}
	}

	return;
}